

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

int __thiscall MatroskaDemuxer::readEncodingCompression(MatroskaDemuxer *this,MatroskaTrack *track)

{
  int *levelUp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  int iVar2;
  int iVar3;
  size_type __new_size;
  uint32_t id;
  int size;
  uint32_t local_54;
  int local_50;
  undefined4 uStack_4c;
  int local_44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  MatroskaTrack *local_38;
  
  iVar2 = ebml_read_master(this,&local_54);
  if (-1 < iVar2) {
    track->encodingAlgo = 0;
    levelUp = &this->level_up;
    local_40 = &track->encodingAlgoPriv;
    iVar2 = 0;
    local_38 = track;
    do {
      if (iVar2 != 0) {
        return 0;
      }
      iVar2 = ebml_read_element_id(this,(uint32_t *)&local_50,levelUp);
      if (iVar2 < 0) {
        return 0;
      }
      if (local_50 == 0) {
        return 0;
      }
      iVar3 = *levelUp;
      if (0 < iVar3) break;
      if (local_50 == 0x4255) {
        iVar2 = ebml_read_binary(this,&local_54,(uint8_t **)&local_50,&local_44);
        pvVar1 = local_40;
        if ((-1 < iVar2) && (__new_size = (size_type)local_44, 0 < (long)__new_size)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_40,__new_size);
          memcpy((pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start,(void *)CONCAT44(uStack_4c,local_50),__new_size);
        }
      }
      else if (local_50 == 0x4254) {
        iVar2 = ebml_read_uint(this,&local_54,(int64_t *)&local_50);
        if (-1 < iVar2) {
          local_38->encodingAlgo = local_50;
        }
      }
      else {
        iVar2 = ebml_read_skip(this);
      }
      iVar3 = *levelUp;
    } while (iVar3 == 0);
    iVar2 = 0;
    *levelUp = iVar3 + -1;
  }
  return iVar2;
}

Assistant:

int MatroskaDemuxer::readEncodingCompression(MatroskaTrack *track)
{
    int res;
    uint32_t id;

    if ((res = ebml_read_master(&id)) < 0)
        return res;

    track->encodingAlgo = 0;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            break;
        }
        if (level_up > 0)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        case MATROSKA_ID_ENCODINGCOMPALGO:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                break;
            track->encodingAlgo = static_cast<int32_t>(num);
            break;
        }
        case MATROSKA_ID_ENCODINGCOMPSETTINGS:
        {
            uint8_t *data;
            int size;
            if ((res = ebml_read_binary(&id, &data, &size)) < 0)
                break;
            if (size > 0)
            {
                track->encodingAlgoPriv.resize(size);
                memcpy(track->encodingAlgoPriv.data(), data, size);
            }
            break;
        }
        default:
            res = ebml_read_skip();
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }
    return 0;
}